

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

string * __thiscall
punky::ast::InfixExpression::to_string_abi_cxx11_
          (string *__return_storage_ptr__,InfixExpression *this)

{
  ExprNode *pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pEVar1 = (this->m_left)._M_t.
           super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>.
           _M_t.
           super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>
           .super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl;
  if ((pEVar1 == (ExprNode *)0x0) ||
     ((this->m_right)._M_t.
      super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>._M_t.
      super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>.
      super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl == (ExprNode *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&bStack_118);
  }
  else {
    (*(pEVar1->super_AstNode)._vptr_AstNode[3])(&local_38);
    std::operator+(&local_b8,"(",&local_38);
    std::operator+(&local_98,&local_b8," ");
    ExprNode::token_literal_abi_cxx11_(&local_d8,&this->super_ExprNode);
    std::operator+(&local_78,&local_98,&local_d8);
    std::operator+(&local_58,&local_78," ");
    (*(((this->m_right)._M_t.
        super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>._M_t
        .super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>.
        super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl)->super_AstNode).
      _vptr_AstNode[3])(&local_f8);
    std::operator+(&bStack_118,&local_58,&local_f8);
    std::operator+(__return_storage_ptr__,&bStack_118,")");
    std::__cxx11::string::~string((string *)&bStack_118);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InfixExpression::to_string() const
{
    return (m_left && m_right) ? "(" + m_left->to_string()
                                   + " " + token_literal() + " "
                                   + m_right->to_string() + ")"
                               : "";
}